

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

size_t __thiscall
kj::Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
::eraseAllImpl<kj::_::IterRange<kj::_::BTreeImpl::Iterator>&>
          (Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
           *this,IterRange<kj::_::BTreeImpl::Iterator> *collection)

{
  uint uVar1;
  Leaf *pLVar2;
  size_t *psVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  size_t sVar6;
  Vector<unsigned_long> *__range2;
  long lVar7;
  size_t newSize;
  uint uVar8;
  Leaf *pLVar9;
  size_t *psVar10;
  Vector<unsigned_long> erased;
  Vector<unsigned_long> local_58;
  NodeUnion *local_38;
  
  local_58.builder.ptr = (size_t *)0x0;
  local_58.builder.pos = (size_t *)0x0;
  local_58.builder.endPtr = (size_t *)0x0;
  local_58.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  pLVar9 = (collection->b).leaf;
  uVar8 = (collection->b).row;
  pLVar2 = (collection->e).leaf;
  uVar1 = (collection->e).row;
  psVar10 = local_58.builder.ptr;
  psVar3 = local_58.builder.pos;
  if (pLVar9 != pLVar2 || uVar8 != uVar1) {
    local_38 = (collection->b).tree;
    do {
      lVar7 = *(long *)(this + 8) - *(long *)this >> 5;
      for (sVar6 = (size_t)(pLVar9->rows[uVar8].i - 1);
          (ulong)(lVar7 - ((long)local_58.builder.pos - (long)local_58.builder.ptr >> 3)) <= sVar6;
          sVar6 = local_58.builder.ptr[lVar7 + ~sVar6]) {
      }
      if (local_58.builder.pos == local_58.builder.endPtr) {
        newSize = (long)local_58.builder.endPtr - (long)local_58.builder.ptr >> 2;
        if (local_58.builder.endPtr == local_58.builder.ptr) {
          newSize = 4;
        }
        Vector<unsigned_long>::setCapacity(&local_58,newSize);
      }
      *local_58.builder.pos = sVar6;
      local_58.builder.pos = local_58.builder.pos + 1;
      uVar8 = uVar8 + 1;
      if (((0xd < uVar8) || (pLVar9->rows[uVar8].i == 0)) && ((ulong)pLVar9->next != 0)) {
        pLVar9 = (Leaf *)(local_38 + pLVar9->next);
        uVar8 = 0;
      }
    } while ((pLVar9 != pLVar2) ||
            (psVar10 = local_58.builder.ptr, psVar3 = local_58.builder.pos, uVar8 != uVar1));
  }
  for (; puVar5 = local_58.builder.endPtr, puVar4 = local_58.builder.ptr, psVar10 != psVar3;
      psVar10 = psVar10 + 1) {
    Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
    ::eraseImpl((Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
                 *)this,*psVar10);
  }
  sVar6 = (long)local_58.builder.pos - (long)local_58.builder.ptr >> 3;
  if (local_58.builder.ptr != (size_t *)0x0) {
    local_58.builder.ptr = (unsigned_long *)0x0;
    local_58.builder.pos = (RemoveConst<unsigned_long> *)0x0;
    local_58.builder.endPtr = (unsigned_long *)0x0;
    (**(local_58.builder.disposer)->_vptr_ArrayDisposer)
              (local_58.builder.disposer,puVar4,8,sVar6,(long)puVar5 - (long)puVar4 >> 3,0);
  }
  return sVar6;
}

Assistant:

size_t Table<Row, Indexes...>::eraseAllImpl(Collection&& collection) {
  // We need to transform the collection of row numbers into a sequence of erasures, accounting
  // for the fact that each erasure re-positions the last row into its slot.
  Vector<size_t> erased;
  _::tryReserveSize(erased, collection);
  for (size_t pos: collection) {
    while (pos >= rows.size() - erased.size()) {
      // Oops, the next item to be erased is already scheduled to be moved to a different location
      // due to a previous erasure. Figure out where it will be at this point.
      size_t erasureNumber = rows.size() - pos - 1;
      pos = erased[erasureNumber];
    }
    erased.add(pos);
  }

  // Now we can execute the sequence of erasures.
  for (size_t pos: erased) {
    eraseImpl(pos);
  }

  return erased.size();
}